

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

QStringList * __thiscall
QSQLiteDriver::tables(QStringList *__return_storage_ptr__,QSQLiteDriver *this,TableType type)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  QSqlResult *pQVar5;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QSqlQuery q;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  cVar4 = (**(code **)(*(long *)this + 0x60))(this);
  if (cVar4 == '\0') goto LAB_00114bb1;
  _q = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = (QSqlResult *)(**(code **)(*(long *)this + 200))(this);
  QSqlQuery::QSqlQuery(&q,pQVar5);
  QSqlQuery::setForwardOnly(SUB81(&q,0));
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data =
       "SELECT name FROM sqlite_master WHERE %1 UNION ALL SELECT name FROM sqlite_temp_master WHERE %1"
  ;
  latin1.m_size = 0x5e;
  QString::QString((QString *)&local_78,latin1);
  if ((~type & 5) == 0) {
    local_90.d = (Data *)0x1b;
    local_90.ptr = L"type=\'table\' OR type=\'view\'";
LAB_00114abb:
    QString::arg<QLatin1String,_true>
              ((QString *)&local_58,(QString *)&local_78,(QLatin1String *)&local_90,0,(QChar)0x20);
    qVar3 = local_78.size;
    pcVar2 = local_78.ptr;
    pDVar1 = local_78.d;
    local_78.d = (Data *)local_58.shared;
    local_78.ptr = (char16_t *)local_58._8_8_;
    local_58.shared = (PrivateShared *)pDVar1;
    local_58._8_8_ = pcVar2;
    local_78.size = local_58._16_8_;
    local_58._16_8_ = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  else {
    if ((type & Tables) != 0) {
      local_90.d = (Data *)0xc;
      local_90.ptr = L"type=\'table\'";
      goto LAB_00114abb;
    }
    if ((type & Views) != 0) {
      local_90.d = (Data *)0xb;
      local_90.ptr = L"type=\'view\'";
      goto LAB_00114abb;
    }
    QString::clear((QString *)&local_78);
  }
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    cVar4 = QSqlQuery::exec((QString *)&q);
    if (cVar4 != '\0') {
      while( true ) {
        cVar4 = QSqlQuery::next();
        if (cVar4 == '\0') break;
        QSqlQuery::value((int)&local_58);
        QVariant::toString();
        QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QVariant::~QVariant((QVariant *)&local_58);
      }
    }
  }
  if ((type & SystemTables) != 0) {
    latin1_00.m_data = "sqlite_master";
    latin1_00.m_size = 0xd;
    QString::QString((QString *)&local_58,latin1_00);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QSqlQuery::~QSqlQuery(&q);
LAB_00114bb1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QSQLiteDriver::tables(QSql::TableType type) const
{
    QStringList res;
    if (!isOpen())
        return res;

    QSqlQuery q(createResult());
    q.setForwardOnly(true);

    QString sql = "SELECT name FROM sqlite_master WHERE %1 "
                  "UNION ALL SELECT name FROM sqlite_temp_master WHERE %1"_L1;
    if ((type & QSql::Tables) && (type & QSql::Views))
        sql = sql.arg("type='table' OR type='view'"_L1);
    else if (type & QSql::Tables)
        sql = sql.arg("type='table'"_L1);
    else if (type & QSql::Views)
        sql = sql.arg("type='view'"_L1);
    else
        sql.clear();

    if (!sql.isEmpty() && q.exec(sql)) {
        while(q.next())
            res.append(q.value(0).toString());
    }

    if (type & QSql::SystemTables) {
        // there are no internal tables beside this one:
        res.append("sqlite_master"_L1);
    }

    return res;
}